

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolver.c
# Opt level: O0

void xSAT_SolverCancelUntil(xSAT_Solver_t *s,int Level)

{
  Vec_Str_t *p;
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int local_18;
  int Var;
  int c;
  int Level_local;
  xSAT_Solver_t *s_local;
  
  iVar1 = xSAT_SolverDecisionLevel(s);
  if (Level < iVar1) {
    local_18 = Vec_IntSize(s->vTrail);
    while( true ) {
      local_18 = local_18 + -1;
      iVar1 = Vec_IntEntry(s->vTrailLim,Level);
      if (local_18 < iVar1) break;
      iVar1 = Vec_IntEntry(s->vTrail,local_18);
      iVar1 = xSAT_Lit2Var(iVar1);
      Vec_StrWriteEntry(s->vAssigns,iVar1,'\x03');
      Vec_IntWriteEntry(s->vReasons,iVar1,-1);
      p = s->vPolarity;
      iVar2 = Vec_IntEntry(s->vTrail,local_18);
      iVar2 = xSAT_LitSign(iVar2);
      Vec_StrWriteEntry(p,iVar1,(char)iVar2);
      iVar2 = xSAT_HeapInHeap(s->hOrder,iVar1);
      if (iVar2 == 0) {
        xSAT_HeapInsert(s->hOrder,iVar1);
      }
    }
    iVar1 = Vec_IntEntry(s->vTrailLim,Level);
    s->iQhead = iVar1;
    p_00 = s->vTrail;
    iVar1 = Vec_IntEntry(s->vTrailLim,Level);
    Vec_IntShrink(p_00,iVar1);
    Vec_IntShrink(s->vTrailLim,Level);
  }
  return;
}

Assistant:

void xSAT_SolverCancelUntil( xSAT_Solver_t * s, int Level )
{
    int c;

    if ( xSAT_SolverDecisionLevel( s ) <= Level )
        return;

    for ( c = Vec_IntSize( s->vTrail ) - 1; c >= Vec_IntEntry( s->vTrailLim, Level ); c-- )
    {
        int Var = xSAT_Lit2Var( Vec_IntEntry( s->vTrail, c ) );

        Vec_StrWriteEntry( s->vAssigns, Var, VarX );
        Vec_IntWriteEntry( s->vReasons, Var, ( int ) CRefUndef );
        Vec_StrWriteEntry( s->vPolarity, Var, ( char )xSAT_LitSign( Vec_IntEntry( s->vTrail, c ) ) );

        if ( !xSAT_HeapInHeap( s->hOrder, Var ) )
            xSAT_HeapInsert( s->hOrder, Var );
    }

    s->iQhead = Vec_IntEntry( s->vTrailLim, Level );
    Vec_IntShrink( s->vTrail, Vec_IntEntry( s->vTrailLim, Level ) );
    Vec_IntShrink( s->vTrailLim, Level );
}